

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O2

void __thiscall
testinator::TestRegistry::Register(TestRegistry *this,Test *test,string *testName,string *suiteName)

{
  uint uVar1;
  random_device rd;
  undefined1 local_13b8 [5000];
  
  std::__cxx11::string::string((string *)local_13b8,(string *)testName);
  local_13b8._32_8_ = test;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,testinator::Test*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
              *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
                      *)local_13b8);
  std::__cxx11::string::~string((string *)local_13b8);
  local_13b8._0_8_ = test;
  std::__cxx11::string::string((string *)(local_13b8 + 8),(string *)testName);
  std::
  _Rb_tree<testinator::Test*,std::pair<testinator::Test*const,std::__cxx11::string>,std::_Select1st<std::pair<testinator::Test*const,std::__cxx11::string>>,std::less<testinator::Test*>,std::allocator<std::pair<testinator::Test*const,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<testinator::Test*const,std::__cxx11::string>>
            ((_Rb_tree<testinator::Test*,std::pair<testinator::Test*const,std::__cxx11::string>,std::_Select1st<std::pair<testinator::Test*const,std::__cxx11::string>>,std::less<testinator::Test*>,std::allocator<std::pair<testinator::Test*const,std::__cxx11::string>>>
              *)&this->m_testNames,
             (pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_13b8);
  std::__cxx11::string::~string((string *)(local_13b8 + 8));
  std::__cxx11::string::string((string *)local_13b8,(string *)suiteName);
  local_13b8._32_8_ = test;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
  ::_M_insert_equal<std::pair<std::__cxx11::string_const,testinator::Test*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
              *)&this->m_testsBySuite,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
              *)local_13b8);
  std::__cxx11::string::~string((string *)local_13b8);
  local_13b8._0_8_ = test;
  std::__cxx11::string::string((string *)(local_13b8 + 8),(string *)suiteName);
  std::
  _Rb_tree<testinator::Test*,std::pair<testinator::Test*const,std::__cxx11::string>,std::_Select1st<std::pair<testinator::Test*const,std::__cxx11::string>>,std::less<testinator::Test*>,std::allocator<std::pair<testinator::Test*const,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<testinator::Test*const,std::__cxx11::string>>
            ((_Rb_tree<testinator::Test*,std::pair<testinator::Test*const,std::__cxx11::string>,std::_Select1st<std::pair<testinator::Test*const,std::__cxx11::string>>,std::less<testinator::Test*>,std::allocator<std::pair<testinator::Test*const,std::__cxx11::string>>>
              *)&this->m_suiteNames,
             (pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_13b8);
  std::__cxx11::string::~string((string *)(local_13b8 + 8));
  std::random_device::random_device((random_device *)local_13b8);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->m_generator,(ulong)uVar1);
  std::random_device::~random_device((random_device *)local_13b8);
  return;
}

Assistant:

void Register(Test* test,
                  const std::string& testName,
                  const std::string& suiteName)
    {
      m_tests.insert({testName, test});
      m_testNames.insert({test, testName});

      m_testsBySuite.insert({suiteName, test});
      m_suiteNames.insert({test, suiteName});

      std::random_device rd;
      m_generator.seed(rd());
    }